

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::exceptions::parsing::parsing(parsing *this,string *message)

{
  string local_38;
  string *local_18;
  string *message_local;
  parsing *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)message);
  exception::exception(&this->super_exception,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_exception = &PTR__parsing_00298db8;
  return;
}

Assistant:

explicit parsing(const std::string& message)
  : exception(message)
  {
  }